

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O2

void __thiscall LengauerTarjan::run(LengauerTarjan *this,int param_1)

{
  (*this->_vptr_LengauerTarjan[1])();
  (*this->_vptr_LengauerTarjan[2])(this);
  (*this->_vptr_LengauerTarjan[3])(this);
  return;
}

Assistant:

void LengauerTarjan::run(int /*root*/) {
	init();
	DFS();

	/*for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<semi[i] <<") ";
		}
		cout <<endl;
	*/
	find_doms();
	/*
		for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<idom[i] <<") ";
		}
		cout <<endl;
	*/
}